

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int poisson_sample(double a,int *seed)

{
  double dVar1;
  ostream *poVar2;
  double dVar3;
  double sumold;
  double sum;
  double next;
  double last;
  int KMAX;
  int i;
  double cdf;
  int *seed_local;
  double a_local;
  
  if (0.0 < a) {
    dVar3 = uniform_01_sample(seed);
    sumold = 0.0;
    for (last._4_4_ = 0; dVar1 = sumold, last._4_4_ < 0x65; last._4_4_ = last._4_4_ + 1) {
      if (last._4_4_ == 0) {
        sumold = exp(-a);
        sum = sumold;
      }
      else {
        sum = (sum * a) / (double)last._4_4_;
        sumold = sumold + sum;
      }
      if ((dVar1 <= dVar3) && (dVar3 <= sumold)) {
        return last._4_4_;
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"POISSON_SAMPLE - Warning!\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  Exceeded KMAX = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
    std::operator<<(poVar2,"\n");
    a_local._4_4_ = 100;
  }
  else {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"POISSON_SAMPLE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  A <= 0.\n");
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int poisson_sample ( double a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    POISSON_SAMPLE samples the Poisson PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the parameter of the PDF.
//    0 < A.
//
//    Input/output, int &SEED, the random number generator seed.
//
//    Output, int POISSON_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  int i;
  int KMAX = 100;
  double last;
  double next;
  double sum;
  double sumold;
//
//  Check.
//
  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "POISSON_SAMPLE - Fatal error!\n";
    cerr << "  A <= 0.\n";
    return 0;
  }
//
//  Pick a random value of CDF.
//
  cdf = uniform_01_sample ( seed );
//
//  Now simply start at K = 0, and find the first value for which
//  CDF(K-1) <= CDF <= CDF(K).
//
  sum = 0.0;

  for ( i = 0; i <= KMAX; i++ )
  {
    sumold = sum;

    if ( i == 0 )
    {
      next = exp ( -a );
      sum = next;
    }
    else
    {
      last = next;
      next = last * a / static_cast< double > ( i);
      sum = sum + next;
    }

    if ( sumold <= cdf && cdf <= sum )
    {
      return i;
    }

  }

  cout << "\n";
  cout << "POISSON_SAMPLE - Warning!\n";
  cout << "  Exceeded KMAX = " << KMAX << "\n";

  return KMAX;
}